

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

string * __thiscall
gl3cts::InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *this,
          _test_iteration iteration)

{
  ostream *poVar1;
  TestError *this_00;
  string type_string;
  string local_1c0 [32];
  stringstream result_sstream;
  ostream local_190;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iteration < TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) {
    std::__cxx11::stringstream::stringstream((stringstream *)&result_sstream);
    type_string._M_dataplus._M_p = (pointer)&type_string.field_2;
    type_string._M_string_length = 0;
    type_string.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&type_string);
    poVar1 = std::operator<<(&local_190,"#version 140\n\nvoid main()\n{\n    if (!");
    poVar1 = std::operator<<(poVar1,(string *)&type_string);
    std::operator<<(poVar1,
                    "(false))\n    {\n        gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n    }\n    else\n    {\n        gl_Position = vec4(2.0, 3.0, 4.0, 5.0);\n    }\n}\n"
                   );
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string((string *)&type_string);
    std::__cxx11::stringstream::~stringstream((stringstream *)&result_sstream);
  }
  else {
    if (1 < iteration - TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized test iteration type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                 ,0x48b);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    type_string._M_dataplus._M_p = (pointer)&type_string.field_2;
    type_string._M_string_length = 0;
    type_string.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)&result_sstream);
    std::__cxx11::string::assign((char *)&type_string);
    poVar1 = std::operator<<(&local_190,"#version 140\n\nvoid main()\n{\n    gl_Position = vec4(");
    poVar1 = std::operator<<(poVar1,(string *)&type_string);
    std::operator<<(poVar1,"(false, true) ? 1.0 : 2.0);\n}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&result_sstream);
    std::__cxx11::string::~string((string *)&type_string);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::getShaderBody(_test_iteration iteration) const
{
	std::string result;

	switch (iteration)
	{
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC2:
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC3:
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC4:
	{
		/* From GL SL spec:
		 *
		 * The logical unary operator not (!). It operates only on a Boolean expression and results in a Boolean
		 * expression. To operate on a vector, use the built-in function not.
		 */
		std::stringstream result_sstream;
		std::string		  type_string;

		type_string = (iteration == TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC2) ?
						  "bvec2" :
						  (iteration == TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC3) ? "bvec3" : "bvec4";

		result_sstream << "#version 140\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    if (!"
					   << type_string << "(false))\n"
										 "    {\n"
										 "        gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n"
										 "    }\n"
										 "    else\n"
										 "    {\n"
										 "        gl_Position = vec4(2.0, 3.0, 4.0, 5.0);\n"
										 "    }\n"
										 "}\n";

		result = result_sstream.str();
		break;
	}

	case TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL:
	case TEST_ITERATION_NOT_FUNC_MUST_NOT_ACCEPT_BOOL:
	{
		std::string		  op_string;
		std::stringstream result_sstream;

		/* From GLSL spec, all() and not() functions are defined as:
		 *
		 * bool all(bvec x)
		 * bvec not(bvec x)
		 *
		 * where bvec is bvec2, bvec3 or bvec4.
		 */
		op_string = (iteration == TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) ? "all" : "not";

		result_sstream << "#version 140\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4("
					   << op_string << "(false, true) ? 1.0 : 2.0);\n"
									   "}\n";

		result = result_sstream.str();
		break;
	}

	default:
		TCU_FAIL("Unrecognized test iteration type");
	} /* switch (iteration) */

	return result;
}